

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *nonz,int rn)

{
  int iVar1;
  int32_t iVar2;
  fpclass_type fVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int32_t iVar6;
  undefined8 *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  fpclass_type fVar11;
  int iVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  undefined4 *puVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  uint *puVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  undefined4 *puVar27;
  uint *puVar28;
  bool bVar29;
  int iVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  int *piVar34;
  int *piVar35;
  cpp_dec_float<200U,_int,_void> *pcVar36;
  byte bVar37;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  ulong local_3a0;
  undefined1 local_388 [32];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [13];
  undefined3 uStack_31b;
  int iStack_318;
  bool bStack_314;
  undefined8 local_310;
  int *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  int *local_2e8;
  int *local_2e0;
  pointer local_2d8;
  int *local_2d0;
  int *local_2c8;
  long local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  undefined8 local_240;
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  fpclass_type local_1c0;
  int32_t iStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [13];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar37 = 0;
  local_238._0_16_ = (undefined1  [16])0x0;
  local_238._16_16_ = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = SUB1613((undefined1  [16])0x0,0);
  iVar9 = 0;
  uStack_1cb = 0;
  local_240._0_4_ = cpp_dec_float_finite;
  local_240._4_4_ = 0x1c;
  local_2b8._0_16_ = (undefined1  [16])0x0;
  local_2b8._16_16_ = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = SUB1613((undefined1  [16])0x0,0);
  uStack_24b = 0;
  iStack_248 = 0;
  bStack_244 = false;
  if (0 < rn) {
    local_2d8 = (this->l).rval.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_2e0 = (this->l).ridx;
    local_2d0 = (this->l).rbeg;
    piVar35 = (this->l).rorig;
    local_2c8 = (this->l).rperm;
    uVar13 = 0;
    do {
      iVar9 = local_2c8[nonz[uVar13]];
      if (uVar13 == 0) {
        lVar20 = 0;
      }
      else {
        uVar31 = uVar13 & 0xffffffff;
        do {
          uVar32 = (uint)uVar31 - 1;
          uVar18 = uVar32 >> 1;
          uVar33 = (uint)uVar31;
          if (iVar9 <= nonz[uVar18]) break;
          nonz[uVar31] = nonz[uVar18];
          uVar31 = (ulong)uVar18;
          uVar33 = uVar18;
        } while (1 < uVar32);
        lVar20 = (long)(int)uVar33;
      }
      uVar13 = uVar13 + 1;
      nonz[lVar20] = iVar9;
    } while (uVar13 != (uint)rn);
    if (rn < 1) {
      iVar9 = 0;
    }
    else {
      piVar17 = nonz + this->thedim;
      iVar9 = 0;
      local_2f8 = eps;
      local_2f0 = vec;
      local_2e8 = piVar35;
      do {
        iVar10 = *nonz;
        uVar33 = rn - 1;
        local_3a0 = (ulong)uVar33;
        iVar8 = nonz[local_3a0];
        iVar16 = 1;
        iVar12 = 0;
        if (3 < (uint)rn) {
          iVar12 = 0;
          do {
            iVar1 = nonz[iVar16];
            iVar30 = nonz[(long)iVar16 + 1];
            if (iVar30 < iVar1) {
              iVar15 = iVar16;
              iVar30 = iVar1;
              if (iVar1 <= iVar8) goto LAB_0053f723;
            }
            else {
              if (iVar30 <= iVar8) goto LAB_0053f723;
              iVar15 = iVar16 + 1;
            }
            nonz[iVar12] = iVar30;
            iVar16 = iVar15 * 2 + 1;
            iVar12 = iVar15;
          } while (iVar16 < (int)(rn - 2U));
        }
        if ((iVar16 < (int)uVar33) && (iVar8 < nonz[iVar16])) {
          nonz[iVar12] = nonz[iVar16];
          iVar12 = iVar16;
        }
LAB_0053f723:
        nonz[iVar12] = iVar8;
        iVar10 = piVar35[iVar10];
        pcVar36 = &local_2f0[iVar10].m_backend;
        pcVar23 = pcVar36;
        puVar25 = (uint *)local_238;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar25 = (pcVar23->data)._M_elems[0];
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar37 * -8 + 4);
          puVar25 = puVar25 + (ulong)bVar37 * -2 + 1;
        }
        iVar8 = local_2f0[iVar10].m_backend.exp;
        bVar29 = local_2f0[iVar10].m_backend.neg;
        fVar11 = local_2f0[iVar10].m_backend.fpclass;
        iVar2 = local_2f0[iVar10].m_backend.prec_elem;
        pcVar23 = pcVar36;
        puVar25 = (uint *)local_388;
        iStack_1c8 = iVar8;
        bStack_1c4 = bVar29;
        local_1c0 = fVar11;
        iStack_1bc = iVar2;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          *puVar25 = (pcVar23->data)._M_elems[0];
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar37 * -8 + 4);
          puVar25 = puVar25 + (ulong)bVar37 * -2 + 1;
        }
        pnVar21 = local_2f8;
        pcVar23 = &local_b0;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          (pcVar23->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar37 * -2 + 1) * 4);
          pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar37 * -2 + 1) * 4)
          ;
        }
        local_b0.exp = (local_2f8->m_backend).exp;
        local_b0.neg = (local_2f8->m_backend).neg;
        local_b0.fpclass = (local_2f8->m_backend).fpclass;
        local_b0.prec_elem = (local_2f8->m_backend).prec_elem;
        local_310._4_4_ = iVar2;
        local_310._0_4_ = fVar11;
        bStack_314 = bVar29;
        if ((bVar29 == true) && (local_388._0_4_ != 0 || fVar11 != cpp_dec_float_finite)) {
          bStack_314 = false;
        }
        iStack_318 = iVar8;
        if ((local_b0.fpclass == cpp_dec_float_NaN || fVar11 == cpp_dec_float_NaN) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_388,&local_b0), iVar8 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar36,0);
        }
        else {
          piVar17[-1] = iVar10;
          local_300 = piVar17 + -1;
          iVar9 = iVar9 + 1;
          iVar8 = local_2d0[iVar10];
          iVar12 = local_2d0[(long)iVar10 + 1] - iVar8;
          piVar17 = local_300;
          if (iVar12 != 0 && iVar8 <= local_2d0[(long)iVar10 + 1]) {
            piVar34 = local_2e0 + iVar8;
            pcVar36 = &local_2d8[iVar8].m_backend;
            do {
              local_2c0 = (long)*piVar34;
              pnVar21 = local_2f0 + local_2c0;
              pnVar24 = pnVar21;
              puVar25 = (uint *)local_2b8;
              for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                *puVar25 = (pnVar24->m_backend).data._M_elems[0];
                pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar24 + ((ulong)bVar37 * -2 + 1) * 4);
                puVar25 = puVar25 + (ulong)bVar37 * -2 + 1;
              }
              iStack_248 = local_2f0[local_2c0].m_backend.exp;
              bStack_244 = local_2f0[local_2c0].m_backend.neg;
              fVar3 = local_2f0[local_2c0].m_backend.fpclass;
              iVar5 = local_2f0[local_2c0].m_backend.prec_elem;
              local_240._0_4_ = fVar3;
              local_240._4_4_ = iVar5;
              if (fVar3 == cpp_dec_float_NaN) {
LAB_0053f91f:
                local_310._0_4_ = cpp_dec_float_finite;
                local_310._4_4_ = 0x1c;
                local_388._0_16_ = (undefined1  [16])0x0;
                local_388._16_16_ = (undefined1  [16])0x0;
                local_368 = (undefined1  [16])0x0;
                local_358 = (undefined1  [16])0x0;
                local_348 = (undefined1  [16])0x0;
                local_338 = (undefined1  [16])0x0;
                local_328 = SUB1613((undefined1  [16])0x0,0);
                uStack_31b = 0;
                iStack_318 = 0;
                bStack_314 = false;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_238;
                if ((cpp_dec_float<200U,_int,_void> *)local_388 != pcVar36) {
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)local_388;
                  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                    (pcVar26->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar23 + (ulong)bVar37 * -8 + 4);
                    pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar26 + (ulong)bVar37 * -8 + 4);
                  }
                  iStack_318 = iStack_1c8;
                  bStack_314 = bStack_1c4;
                  local_310._4_4_ = iStack_1bc;
                  local_310._0_4_ = local_1c0;
                  pcVar23 = pcVar36;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          ((cpp_dec_float<200U,_int,_void> *)local_388,pcVar23);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                           (cpp_dec_float<200U,_int,_void> *)local_388);
                fVar11 = cpp_dec_float_NaN;
                if ((fpclass_type)local_240 == cpp_dec_float_NaN) {
LAB_0053fa17:
                  puVar22 = (undefined4 *)local_2b8;
                  puVar27 = (undefined4 *)local_1b8;
                  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                    *puVar27 = *puVar22;
                    puVar22 = puVar22 + (ulong)bVar37 * -2 + 1;
                    puVar27 = puVar27 + (ulong)bVar37 * -2 + 1;
                  }
                  puVar7 = &local_240;
                  iVar10 = iStack_248;
                  bVar29 = bStack_244;
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>
                            ((cpp_dec_float<200U,_int,_void> *)local_388,0,(type *)0x0);
                  iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                                      (cpp_dec_float<200U,_int,_void> *)local_388);
                  if (iVar10 != 0) {
                    fVar11 = (fpclass_type)local_240;
                    goto LAB_0053fa17;
                  }
                  local_140._0_4_ = cpp_dec_float_finite;
                  local_140._4_4_ = 0x1c;
                  local_1b8._0_16_ = (undefined1  [16])0x0;
                  local_1b8._16_16_ = (undefined1  [16])0x0;
                  local_198 = (undefined1  [16])0x0;
                  local_188 = (undefined1  [16])0x0;
                  local_178 = (undefined1  [16])0x0;
                  local_168 = (undefined1  [16])0x0;
                  local_158 = SUB1613((undefined1  [16])0x0,0);
                  uStack_14b = 0;
                  iStack_148 = 0;
                  bStack_144 = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_1b8,1e-100);
                  puVar7 = &local_140;
                  fVar11 = (fpclass_type)local_140;
                  iVar10 = iStack_148;
                  bVar29 = bStack_144;
                }
                iVar2 = *(int32_t *)((long)puVar7 + 4);
                puVar25 = (uint *)local_1b8;
                pnVar24 = pnVar21;
                for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                  (pnVar24->m_backend).data._M_elems[0] = *puVar25;
                  puVar25 = puVar25 + (ulong)bVar37 * -2 + 1;
                  pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar24 + ((ulong)bVar37 * -2 + 1) * 4);
                }
                (pnVar21->m_backend).exp = iVar10;
                (pnVar21->m_backend).neg = bVar29;
                (pnVar21->m_backend).fpclass = fVar11;
                (pnVar21->m_backend).prec_elem = iVar2;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_388,0,(type *)0x0);
                iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                                   (cpp_dec_float<200U,_int,_void> *)local_388);
                iVar2 = iStack_1bc;
                fVar11 = local_1c0;
                iVar10 = iStack_1c8;
                if (iVar8 != 0) goto LAB_0053f91f;
                puVar25 = (uint *)local_238;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
                for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                  (pcVar23->data)._M_elems[0] = *puVar25;
                  puVar25 = puVar25 + (ulong)bVar37 * -2 + 1;
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + (ulong)bVar37 * -8 + 4);
                }
                iStack_148 = iStack_1c8;
                bStack_144 = bStack_1c4;
                local_140._4_4_ = iStack_1bc;
                local_140._0_4_ = local_1c0;
                bVar14 = bStack_1c4;
                if (local_1b8._0_4_ != 0 || local_1c0 != cpp_dec_float_finite) {
                  bVar14 = bStack_1c4 ^ 1;
                  bStack_144 = (bool)bVar14;
                }
                local_310._0_4_ = cpp_dec_float_finite;
                local_310._4_4_ = 0x1c;
                local_388._0_16_ = (undefined1  [16])0x0;
                local_388._16_16_ = (undefined1  [16])0x0;
                local_368 = (undefined1  [16])0x0;
                local_358 = (undefined1  [16])0x0;
                local_348 = (undefined1  [16])0x0;
                local_338 = (undefined1  [16])0x0;
                local_328 = SUB1613((undefined1  [16])0x0,0);
                uStack_31b = 0;
                iStack_318 = 0;
                bStack_314 = false;
                pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
                bStack_144 = (bool)bVar14;
                if ((cpp_dec_float<200U,_int,_void> *)local_388 != pcVar36) {
                  puVar25 = (uint *)local_238;
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_388;
                  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                    (pcVar23->data)._M_elems[0] = *puVar25;
                    puVar25 = puVar25 + (ulong)bVar37 * -2 + 1;
                    pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar23 + (ulong)bVar37 * -8 + 4);
                  }
                  iStack_318 = iVar10;
                  local_310._0_4_ = fVar11;
                  local_310._4_4_ = iVar2;
                  pcVar23 = pcVar36;
                  bStack_314 = (bool)bVar14;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          ((cpp_dec_float<200U,_int,_void> *)local_388,pcVar23);
                puVar25 = (uint *)local_388;
                puVar28 = (uint *)local_2b8;
                for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                  *puVar28 = *puVar25;
                  puVar25 = puVar25 + (ulong)bVar37 * -2 + 1;
                  puVar28 = puVar28 + (ulong)bVar37 * -2 + 1;
                }
                iStack_248 = iStack_318;
                bStack_244 = bStack_314;
                local_240._0_4_ = (fpclass_type)local_310;
                local_240._4_4_ = local_310._4_4_;
                puVar25 = (uint *)local_2b8;
                puVar28 = (uint *)local_388;
                for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                  *puVar28 = *puVar25;
                  puVar25 = puVar25 + (ulong)bVar37 * -2 + 1;
                  puVar28 = puVar28 + (ulong)bVar37 * -2 + 1;
                }
                pnVar24 = local_2f8;
                pcVar23 = &local_130;
                for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                  (pcVar23->data)._M_elems[0] = (pnVar24->m_backend).data._M_elems[0];
                  pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar24 + ((ulong)bVar37 * -2 + 1) * 4);
                  pcVar23 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar23 + ((ulong)bVar37 * -2 + 1) * 4);
                }
                local_130.exp = (local_2f8->m_backend).exp;
                local_130.neg = (local_2f8->m_backend).neg;
                fVar4 = (local_2f8->m_backend).fpclass;
                iVar6 = (local_2f8->m_backend).prec_elem;
                local_130.fpclass = fVar4;
                local_130.prec_elem = iVar6;
                if ((bStack_314 == true) &&
                   (local_388._0_4_ != 0 || (fpclass_type)local_310 != cpp_dec_float_finite)) {
                  bStack_314 = false;
                }
                if ((fVar4 != cpp_dec_float_NaN && (fpclass_type)local_310 != cpp_dec_float_NaN) &&
                   (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare((cpp_dec_float<200U,_int,_void> *)local_388,&local_130),
                   0 < iVar10)) {
                  puVar25 = (uint *)local_2b8;
                  pnVar24 = pnVar21;
                  for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
                    (pnVar24->m_backend).data._M_elems[0] = *puVar25;
                    puVar25 = puVar25 + (ulong)bVar37 * -2 + 1;
                    pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar24 + ((ulong)bVar37 * -2 + 1) * 4);
                  }
                  (pnVar21->m_backend).exp = iStack_248;
                  (pnVar21->m_backend).neg = bStack_244;
                  (pnVar21->m_backend).fpclass = (fpclass_type)local_240;
                  (pnVar21->m_backend).prec_elem = local_240._4_4_;
                  iVar10 = local_2c8[local_2c0];
                  uVar18 = (uint)local_3a0;
                  uVar33 = uVar18;
                  if (0 < (int)uVar18) {
                    do {
                      uVar19 = (uint)local_3a0 - 1;
                      uVar32 = uVar19 >> 1;
                      uVar33 = (uint)local_3a0;
                      if (iVar10 <= nonz[uVar32]) break;
                      nonz[local_3a0] = nonz[uVar32];
                      local_3a0 = (ulong)uVar32;
                      uVar33 = uVar32;
                    } while (1 < uVar19);
                  }
                  local_3a0 = (ulong)(uVar18 + 1);
                  nonz[(int)uVar33] = iVar10;
                }
              }
              piVar34 = piVar34 + 1;
              pcVar36 = pcVar36 + 1;
              bVar29 = 1 < iVar12;
              piVar17 = local_300;
              piVar35 = local_2e8;
              iVar12 = iVar12 + -1;
              uVar33 = (uint)local_3a0;
            } while (bVar29);
          }
        }
        local_3a0._0_4_ = uVar33;
        rn = (uint)local_3a0;
      } while (0 < (int)(uint)local_3a0);
      if (0 < iVar9) {
        lVar20 = 0;
        do {
          nonz[lVar20] = piVar17[lVar20];
          lVar20 = lVar20 + 1;
        } while (iVar9 != (int)lVar20);
      }
    }
  }
  return iVar9;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}